

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

aom_codec_err_t
av1_copy_new_frame_enc(AV1_COMMON *cm,YV12_BUFFER_CONFIG *new_frame,YV12_BUFFER_CONFIG *sd)

{
  int iVar1;
  YV12_BUFFER_CONFIG *in_RDX;
  YV12_BUFFER_CONFIG *in_RSI;
  AV1_COMMON *in_RDI;
  int num_planes;
  
  av1_num_planes(in_RDI);
  iVar1 = equal_dimensions_and_border(in_RSI,in_RDX);
  if (iVar1 == 0) {
    aom_internal_error(in_RDI->error,AOM_CODEC_ERROR,"Incorrect buffer dimensions");
  }
  else {
    aom_yv12_copy_frame_c((YV12_BUFFER_CONFIG *)cm,new_frame,sd._4_4_);
  }
  return in_RDI->error->error_code;
}

Assistant:

aom_codec_err_t av1_copy_new_frame_enc(AV1_COMMON *cm,
                                       YV12_BUFFER_CONFIG *new_frame,
                                       YV12_BUFFER_CONFIG *sd) {
  const int num_planes = av1_num_planes(cm);
  if (!equal_dimensions_and_border(new_frame, sd))
    aom_internal_error(cm->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(new_frame, sd, num_planes);

  return cm->error->error_code;
}